

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AC3DImporter::LoadObjectSection
          (AC3DImporter *this,
          vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
          *objects)

{
  char **in;
  pointer *pppVar1;
  pointer *ppaVar2;
  float fVar3;
  pointer pOVar4;
  vector<aiLight*,std::allocator<aiLight*>> *this_00;
  iterator __position;
  pointer pSVar5;
  iterator __position_00;
  pointer ppVar6;
  iterator __position_01;
  pointer paVar7;
  void *pvVar8;
  aiVector2D *paVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ai_uint32 aVar13;
  aiLight *paVar14;
  size_t sVar15;
  char *pcVar16;
  byte *pbVar17;
  Logger *pLVar18;
  byte *pbVar19;
  runtime_error *prVar20;
  char cVar21;
  Type TVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  uint i_1;
  uint i;
  Assimp *pAVar28;
  char *pcVar29;
  uint uVar30;
  byte *pbVar31;
  aiLight *light;
  aiLight *local_178;
  string *local_170;
  int local_164;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_160;
  string *local_158;
  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_> *local_150;
  vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
  *local_148;
  AC3DImporter *local_140;
  undefined1 local_138 [4];
  float fStack_134;
  float fStack_130;
  undefined4 uStack_12c;
  pointer local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> local_110;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [5];
  pointer local_98;
  pointer local_88;
  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_> local_80;
  aiVector2D *local_58;
  aiVector3D *local_50;
  aiMatrix3x3 *local_48;
  aiVector2D *local_40;
  size_type local_38;
  
  pcVar16 = this->buffer;
  iVar12 = strncmp("OBJECT",pcVar16,6);
  if (iVar12 == 0) {
    bVar27 = pcVar16[6];
    if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
      in = &this->buffer;
      pcVar29 = pcVar16 + 7;
      if (bVar27 == 0) {
        pcVar29 = pcVar16 + 6;
      }
      *in = pcVar29;
      for (; (*pcVar29 == ' ' || (*pcVar29 == '\t')); pcVar29 = pcVar29 + 1) {
      }
      this->buffer = pcVar29;
      this->mNumMeshes = this->mNumMeshes + 1;
      Object::Object((Object *)local_138);
      std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
      emplace_back<Assimp::AC3DImporter::Object>(objects,(Object *)local_138);
      std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
      ~vector(&local_80);
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != local_e8) {
        operator_delete(local_f8._M_p,local_e8[0]._M_allocated_capacity + 1);
      }
      std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
      ~vector(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_12c,fStack_130) != &aStack_120) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_12c,fStack_130),aStack_120._M_allocated_capacity + 1);
      }
      pOVar4 = (objects->
               super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_178 = (aiLight *)0x0;
      pcVar16 = *in;
      if (pcVar16 == (char *)0x0) {
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                      ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      iVar12 = strncasecmp(pcVar16,"light",5);
      if (iVar12 == 0) {
        this_00 = (vector<aiLight*,std::allocator<aiLight*>> *)this->mLights;
        paVar14 = (aiLight *)operator_new(0x46c);
        (paVar14->mName).length = 0;
        (paVar14->mName).data[0] = '\0';
        memset((paVar14->mName).data + 1,0x1b,0x3ff);
        paVar14->mType = aiLightSource_UNDEFINED;
        (paVar14->mPosition).x = 0.0;
        (paVar14->mPosition).y = 0.0;
        (paVar14->mPosition).z = 0.0;
        (paVar14->mDirection).x = 0.0;
        (paVar14->mDirection).y = 0.0;
        *(undefined8 *)&(paVar14->mDirection).z = 0;
        (paVar14->mUp).x = 0.0;
        (paVar14->mUp).y = 0.0;
        *(undefined8 *)&(paVar14->mUp).z = 0;
        paVar14->mAttenuationLinear = 1.0;
        paVar14->mAttenuationQuadratic = 0.0;
        (paVar14->mColorDiffuse).r = 0.0;
        (paVar14->mColorDiffuse).g = 0.0;
        (paVar14->mColorDiffuse).b = 0.0;
        (paVar14->mColorSpecular).r = 0.0;
        (paVar14->mColorSpecular).g = 0.0;
        *(undefined8 *)&(paVar14->mColorSpecular).b = 0;
        (paVar14->mColorAmbient).g = 0.0;
        (paVar14->mColorAmbient).b = 0.0;
        paVar14->mAngleInnerCone = 6.2831855;
        paVar14->mAngleOuterCone = 6.2831855;
        (paVar14->mSize).x = 0.0;
        (paVar14->mSize).y = 0.0;
        __position._M_current = *(aiLight ***)(this_00 + 8);
        local_178 = paVar14;
        if (__position._M_current == *(aiLight ***)(this_00 + 0x10)) {
          std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                    (this_00,__position,&local_178);
        }
        else {
          *__position._M_current = paVar14;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        local_178->mType = aiLightSource_POINT;
        (local_178->mColorSpecular).r = 1.0;
        (local_178->mColorSpecular).g = 1.0;
        (local_178->mColorSpecular).b = 1.0;
        (local_178->mColorDiffuse).r = 1.0;
        (local_178->mColorDiffuse).g = 1.0;
        (local_178->mColorDiffuse).b = 1.0;
        local_178->mAttenuationConstant = 1.0;
        aVar13 = snprintf((local_178->mName).data,0x400,"ACLight_%i",
                          (ulong)((int)((ulong)((long)(this->mLights->
                                                                                                            
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->mLights->
                                                                                                          
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                 - 1));
        paVar14 = local_178;
        (local_178->mName).length = aVar13;
        pcVar16 = (local_178->mName).data;
        _local_138 = &local_128;
        sVar15 = strlen(pcVar16);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,pcVar16,(paVar14->mName).data + sVar15);
        std::__cxx11::string::operator=((string *)&pOVar4[-1].name,(string *)local_138);
        if (_local_138 != &local_128) {
          operator_delete(_local_138,(ulong)((long)&local_128->first + 1));
        }
        pLVar18 = DefaultLogger::get();
        Logger::debug(pLVar18,"AC3D: Light source encountered");
        TVar22 = Light;
      }
      else {
        iVar12 = strncasecmp(pcVar16,"group",5);
        if (iVar12 == 0) {
          TVar22 = Group;
        }
        else {
          iVar12 = strncasecmp(pcVar16,"world",5);
          TVar22 = (Type)(iVar12 != 0);
        }
      }
      pOVar4[-1].type = TVar22;
      bVar10 = GetNextLine(this);
      if (bVar10) {
        local_170 = (string *)&pOVar4[-1].name;
        local_158 = (string *)&pOVar4[-1].texture;
        local_58 = &pOVar4[-1].texRepeat;
        local_40 = &pOVar4[-1].texOffset;
        local_48 = &pOVar4[-1].rotation;
        local_50 = &pOVar4[-1].translation;
        local_160 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    &pOVar4[-1].vertices;
        local_150 = &pOVar4[-1].surfaces;
        local_140 = this;
        do {
          pcVar16 = *in;
          iVar12 = strncmp("kids",pcVar16,4);
          if (iVar12 == 0) {
            bVar27 = pcVar16[4];
            if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
              pcVar16 = pcVar16 + (5 - (ulong)(bVar27 == 0));
              *in = pcVar16;
              for (; (*pcVar16 == ' ' || (*pcVar16 == '\t')); pcVar16 = pcVar16 + 1) {
              }
              *in = pcVar16;
              cVar21 = *pcVar16;
              uVar23 = 0;
              if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                uVar23 = 0;
                do {
                  uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                  cVar21 = pcVar16[1];
                  pcVar16 = pcVar16 + 1;
                } while (0xf5 < (byte)(cVar21 - 0x3aU));
              }
              this->buffer = pcVar16;
              GetNextLine(this);
              if (uVar23 == 0) {
                return;
              }
              std::
              vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
              reserve(&pOVar4[-1].children,(ulong)uVar23);
              do {
                LoadObjectSection(this,&pOVar4[-1].children);
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
              return;
            }
          }
          pcVar16 = *in;
          iVar12 = strncmp("name",pcVar16,4);
          if (iVar12 == 0) {
            bVar27 = pcVar16[4];
            if ((0x20 < (ulong)bVar27) || ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) == 0))
            goto LAB_0040302a;
            pbVar19 = (byte *)(pcVar16 + 5);
            if (bVar27 == 0) {
              pbVar19 = (byte *)(pcVar16 + 4);
            }
            *in = (char *)pbVar19;
            uVar23 = ~(uint)pbVar19;
            while( true ) {
              pbVar31 = pbVar19 + 1;
              if ((*pbVar19 != 0x20) && (*pbVar19 != 9)) break;
              uVar23 = uVar23 - 1;
              pbVar19 = pbVar31;
            }
            *in = (char *)pbVar19;
            pbVar17 = pbVar31;
            if (*pbVar19 == 0) {
              prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_138 = &local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_138,"AC3D: Unexpected EOF in string","");
              std::runtime_error::runtime_error(prVar20,(string *)local_138);
              *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_004031be:
            *in = (char *)pbVar17;
            uVar26 = (ulong)*pbVar17;
            if (0x22 < uVar26) {
LAB_004031d6:
              pbVar17 = pbVar17 + 1;
              goto LAB_004031be;
            }
            if ((0x3401UL >> (uVar26 & 0x3f) & 1) == 0) {
              if (uVar26 == 0x22) goto LAB_00403213;
              goto LAB_004031d6;
            }
            pLVar18 = DefaultLogger::get();
            Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::_M_replace
                      ((ulong)local_170,0,(char *)pOVar4[-1].name._M_string_length,0x6ddcc8);
LAB_00403213:
            uVar30 = (uint)(byte)**in;
            if ((0xd < uVar30) || ((0x3401U >> (uVar30 & 0x1f) & 1) == 0)) {
              _local_138 = &local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_138,pbVar31,pbVar31 + ((int)*in + uVar23));
              std::__cxx11::string::operator=(local_170,(string *)local_138);
              if (_local_138 != &local_128) {
                operator_delete(_local_138,(ulong)((long)&local_128->first + 1));
              }
              paVar14 = local_178;
              *in = *in + 1;
              if ((local_178 != (aiLight *)0x0) &&
                 (uVar26 = pOVar4[-1].name._M_string_length, uVar26 < 0x400)) {
                (local_178->mName).length = (ai_uint32)uVar26;
                memcpy((local_178->mName).data,*(void **)local_170,uVar26);
                (paVar14->mName).data[uVar26] = '\0';
              }
            }
          }
          else {
LAB_0040302a:
            pcVar16 = *in;
            iVar12 = strncmp("texture",pcVar16,7);
            if (iVar12 == 0) {
              bVar27 = pcVar16[7];
              if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                pbVar19 = (byte *)(pcVar16 + 8);
                if (bVar27 == 0) {
                  pbVar19 = (byte *)(pcVar16 + 7);
                }
                *in = (char *)pbVar19;
                uVar23 = ~(uint)pbVar19;
                while( true ) {
                  pbVar31 = pbVar19 + 1;
                  if ((*pbVar19 != 0x20) && (*pbVar19 != 9)) break;
                  uVar23 = uVar23 - 1;
                  pbVar19 = pbVar31;
                }
                *in = (char *)pbVar19;
                pbVar17 = pbVar31;
                if (*pbVar19 == 0) {
                  prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                  _local_138 = &local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,"AC3D: Unexpected EOF in string","");
                  std::runtime_error::runtime_error(prVar20,(string *)local_138);
                  *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
                  __cxa_throw(prVar20,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
LAB_00403322:
                *in = (char *)pbVar17;
                uVar26 = (ulong)*pbVar17;
                if (0x22 < uVar26) {
LAB_0040333a:
                  pbVar17 = pbVar17 + 1;
                  goto LAB_00403322;
                }
                if ((0x3401UL >> (uVar26 & 0x3f) & 1) == 0) {
                  if (uVar26 == 0x22) goto LAB_00403377;
                  goto LAB_0040333a;
                }
                pLVar18 = DefaultLogger::get();
                Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL in string");
                std::__cxx11::string::_M_replace
                          ((ulong)local_158,0,(char *)pOVar4[-1].texture._M_string_length,0x6ddcc8);
LAB_00403377:
                uVar30 = (uint)(byte)**in;
                if ((0xd < uVar30) || ((0x3401U >> (uVar30 & 0x1f) & 1) == 0)) {
                  _local_138 = &local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138,pbVar31,pbVar31 + ((int)*in + uVar23));
                  std::__cxx11::string::operator=(local_158,(string *)local_138);
                  if (_local_138 != &local_128) {
                    operator_delete(_local_138,(ulong)((long)&local_128->first + 1));
                  }
                  *in = *in + 1;
                }
                goto LAB_00403715;
              }
            }
            pcVar16 = *in;
            iVar12 = strncmp("texrep",pcVar16,6);
            paVar9 = local_58;
            if (iVar12 == 0) {
              bVar27 = pcVar16[6];
              if ((0x20 < (ulong)bVar27) || ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) == 0))
              goto LAB_00403068;
              pbVar19 = (byte *)(pcVar16 + 6);
              pbVar31 = (byte *)(pcVar16 + 7);
              if (bVar27 == 0) {
                pbVar31 = pbVar19;
              }
              *in = (char *)pbVar31;
              for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
              }
              *in = (char *)pbVar31;
              for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
              }
              *in = (char *)pbVar31;
              if ((0xd < *pbVar31) ||
                 (pbVar19 = (byte *)0x3401, (0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                lVar25 = 0;
                do {
                  for (pAVar28 = (Assimp *)*in;
                      (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1
                      ) {
                  }
                  *in = (char *)pAVar28;
                  if (((byte)*pAVar28 < 0xe) &&
                     (pbVar19 = (byte *)0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0)) {
                    pLVar18 = DefaultLogger::get();
                    Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                  }
                  else {
                    pcVar16 = fast_atoreal_move<float>
                                        (pAVar28,(char *)(&paVar9->x + lVar25),(float *)0x1,
                                         SUB81(pbVar19,0));
                    *in = pcVar16;
                  }
                  bVar10 = lVar25 == 0;
                  lVar25 = lVar25 + 1;
                } while (bVar10);
                fVar3 = pOVar4[-1].texRepeat.x;
                if (((fVar3 == 0.0) && (!NAN(fVar3))) ||
                   ((fVar3 = pOVar4[-1].texRepeat.y, fVar3 == 0.0 && (!NAN(fVar3))))) {
                  pOVar4[-1].texRepeat.x = 1.0;
                  pOVar4[-1].texRepeat.y = 1.0;
                }
                goto LAB_00403715;
              }
LAB_00403701:
              pLVar18 = DefaultLogger::get();
              pcVar16 = "AC3D: Unexpected EOF/EOL";
LAB_00403710:
              Logger::error(pLVar18,pcVar16);
            }
            else {
LAB_00403068:
              pcVar16 = *in;
              iVar12 = strncmp("texoff",pcVar16,6);
              if (iVar12 == 0) {
                bVar27 = pcVar16[6];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pbVar19 = (byte *)(pcVar16 + 6);
                  pbVar31 = (byte *)(pcVar16 + 7);
                  if (bVar27 == 0) {
                    pbVar31 = pbVar19;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) ||
                     (pbVar19 = (byte *)0x3401, (0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar25 = 0;
                    do {
                      for (pAVar28 = (Assimp *)*in;
                          (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                          pAVar28 = pAVar28 + 1) {
                      }
                      *in = (char *)pAVar28;
                      if (((byte)*pAVar28 < 0xe) &&
                         (pbVar19 = (byte *)0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0))
                      {
                        pLVar18 = DefaultLogger::get();
                        Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar16 = fast_atoreal_move<float>
                                            (pAVar28,(char *)(&local_40->x + lVar25),(float *)0x1,
                                             SUB81(pbVar19,0));
                        *in = pcVar16;
                      }
                      bVar10 = lVar25 == 0;
                      lVar25 = lVar25 + 1;
                    } while (bVar10);
                    goto LAB_00403715;
                  }
                  goto LAB_00403701;
                }
              }
              pcVar16 = *in;
              iVar12 = strncmp("rot",pcVar16,3);
              if (iVar12 == 0) {
                bVar27 = pcVar16[3];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pbVar19 = (byte *)(pcVar16 + 3);
                  pbVar31 = (byte *)(pcVar16 + 4);
                  if (bVar27 == 0) {
                    pbVar31 = pbVar19;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) ||
                     (pbVar19 = (byte *)0x3401, (0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar25 = 0;
                    do {
                      for (pAVar28 = (Assimp *)*in;
                          (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                          pAVar28 = pAVar28 + 1) {
                      }
                      *in = (char *)pAVar28;
                      if (((byte)*pAVar28 < 0xe) &&
                         (pbVar19 = (byte *)0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0))
                      {
                        pLVar18 = DefaultLogger::get();
                        Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar16 = fast_atoreal_move<float>
                                            (pAVar28,(char *)(&local_48->a1 + lVar25),(float *)0x1,
                                             SUB81(pbVar19,0));
                        *in = pcVar16;
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 != 9);
                    goto LAB_00403715;
                  }
                  goto LAB_00403701;
                }
              }
              pcVar16 = *in;
              iVar12 = strncmp("loc",pcVar16,3);
              if (iVar12 == 0) {
                bVar27 = pcVar16[3];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pbVar19 = (byte *)(pcVar16 + 3);
                  pbVar31 = (byte *)(pcVar16 + 4);
                  if (bVar27 == 0) {
                    pbVar31 = pbVar19;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) ||
                     (pbVar19 = (byte *)0x3401, (0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar25 = 0;
                    do {
                      for (pAVar28 = (Assimp *)*in;
                          (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                          pAVar28 = pAVar28 + 1) {
                      }
                      *in = (char *)pAVar28;
                      if (((byte)*pAVar28 < 0xe) &&
                         (pbVar19 = (byte *)0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0))
                      {
                        pLVar18 = DefaultLogger::get();
                        Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar16 = fast_atoreal_move<float>
                                            (pAVar28,(char *)(&local_50->x + lVar25),(float *)0x1,
                                             SUB81(pbVar19,0));
                        *in = pcVar16;
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 != 3);
                    goto LAB_00403715;
                  }
                  goto LAB_00403701;
                }
              }
              pcVar16 = *in;
              iVar12 = strncmp("subdiv",pcVar16,6);
              if (iVar12 == 0) {
                bVar27 = pcVar16[6];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pcVar29 = pcVar16 + 7;
                  if (bVar27 == 0) {
                    pcVar29 = pcVar16 + 6;
                  }
                  *in = pcVar29;
                  for (; (*pcVar29 == ' ' || (*pcVar29 == '\t')); pcVar29 = pcVar29 + 1) {
                  }
                  *in = pcVar29;
                  cVar21 = *pcVar29;
                  uVar23 = 0;
                  if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                    uVar23 = 0;
                    do {
                      uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                      cVar21 = pcVar29[1];
                      pcVar29 = pcVar29 + 1;
                    } while (0xf5 < (byte)(cVar21 - 0x3aU));
                  }
                  *in = pcVar29;
                  pOVar4[-1].subDiv = uVar23;
                  goto LAB_00403715;
                }
              }
              pcVar16 = *in;
              iVar12 = strncmp("crease",pcVar16,6);
              if (iVar12 == 0) {
                bVar27 = pcVar16[6];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pAVar28 = (Assimp *)(pcVar16 + 7);
                  if (bVar27 == 0) {
                    pAVar28 = (Assimp *)(pcVar16 + 6);
                  }
                  *in = (char *)pAVar28;
                  for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                      pAVar28 = pAVar28 + 1) {
                  }
                  *in = (char *)pAVar28;
                  local_138 = (undefined1  [4])0x0;
                  fast_atoreal_move<float>
                            (pAVar28,local_138,(float *)0x1,SUB81((Assimp *)(pcVar16 + 6),0));
                  pOVar4[-1].crease = (float)local_138;
                  goto LAB_00403715;
                }
              }
              pcVar16 = *in;
              iVar12 = strncmp("numvert",pcVar16,7);
              if (iVar12 == 0) {
                bVar27 = pcVar16[7];
                if (((ulong)bVar27 < 0x21) && ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
                  pcVar29 = pcVar16 + 8;
                  if (bVar27 == 0) {
                    pcVar29 = pcVar16 + 7;
                  }
                  *in = pcVar29;
                  for (; (*pcVar29 == ' ' || (*pcVar29 == '\t')); pcVar29 = pcVar29 + 1) {
                  }
                  *in = pcVar29;
                  cVar21 = *pcVar29;
                  uVar23 = 0;
                  if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                    uVar23 = 0;
                    do {
                      uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                      cVar21 = pcVar29[1];
                      pcVar29 = pcVar29 + 1;
                    } while (0xf5 < (byte)(cVar21 - 0x3aU));
                  }
                  *in = pcVar29;
                  if (0x1555554 < uVar23) {
                    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                    _local_138 = &local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_138,
                               "AC3D: Too many vertices, would run out of memory","");
                    std::runtime_error::runtime_error(prVar20,(string *)local_138);
                    *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_160,(ulong)uVar23);
                  if (uVar23 != 0) {
                    uVar30 = 0;
                    do {
                      bVar10 = GetNextLine(this);
                      if (!bVar10) {
                        pLVar18 = DefaultLogger::get();
                        pcVar16 = "AC3D: Unexpected EOF: not all vertices have been parsed yet";
                        goto LAB_00403710;
                      }
                      cVar21 = **in;
                      if (((9 < (byte)(cVar21 - 0x30U)) && (cVar21 != '+')) && (cVar21 != '-')) {
                        pLVar18 = DefaultLogger::get();
                        Logger::error(pLVar18,
                                      "AC3D: Unexpected token: not all vertices have been parsed yet"
                                     );
                        *in = *in + -1;
                        break;
                      }
                      local_138 = (undefined1  [4])0x0;
                      fStack_134 = 0.0;
                      fStack_130 = 0.0;
                      __position_01._M_current =
                           pOVar4[-1].vertices.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (__position_01._M_current ==
                          pOVar4[-1].vertices.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                        _M_realloc_insert<aiVector3t<float>>
                                  (local_160,__position_01,(aiVector3t<float> *)local_138);
                      }
                      else {
                        (__position_01._M_current)->z = 0.0;
                        (__position_01._M_current)->x = 0.0;
                        (__position_01._M_current)->y = 0.0;
                        ppaVar2 = &pOVar4[-1].vertices.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar2 = *ppaVar2 + 1;
                      }
                      paVar7 = pOVar4[-1].vertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      pbVar19 = (byte *)*in;
                      while( true ) {
                        bVar27 = *pbVar19;
                        uVar26 = (ulong)bVar27;
                        if ((bVar27 != 0x20) && (bVar27 != 9)) break;
                        pbVar19 = pbVar19 + 1;
                      }
                      *in = (char *)pbVar19;
                      if ((*pbVar19 < 0xe) &&
                         (uVar26 = 0x3401, (0x3401U >> (*pbVar19 & 0x1f) & 1) != 0)) {
                        pLVar18 = DefaultLogger::get();
                        Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        lVar25 = 0;
                        do {
                          for (pAVar28 = (Assimp *)*in;
                              (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                              pAVar28 = pAVar28 + 1) {
                          }
                          *in = (char *)pAVar28;
                          if (((byte)*pAVar28 < 0xe) &&
                             (uVar26 = 0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0)) {
                            pLVar18 = DefaultLogger::get();
                            Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                          }
                          else {
                            pcVar16 = fast_atoreal_move<float>
                                                (pAVar28,(char *)(&paVar7[-1].x + lVar25),
                                                 (float *)0x1,SUB81(uVar26,0));
                            *in = pcVar16;
                          }
                          lVar25 = lVar25 + 1;
                        } while (lVar25 != 3);
                      }
                      uVar30 = uVar30 + 1;
                      this = local_140;
                    } while (uVar30 != uVar23);
                  }
                  goto LAB_00403715;
                }
              }
              bVar10 = TokenMatch<char_const>(in,"numsurf",7);
              if (bVar10) {
                for (pcVar16 = *in; (*pcVar16 == ' ' || (*pcVar16 == '\t')); pcVar16 = pcVar16 + 1)
                {
                }
                *in = pcVar16;
                cVar21 = *pcVar16;
                uVar26 = 0;
                if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                  uVar26 = 0;
                  do {
                    uVar26 = (ulong)((uint)(byte)(cVar21 - 0x30) + (int)uVar26 * 10);
                    cVar21 = pcVar16[1];
                    pcVar16 = pcVar16 + 1;
                  } while (0xf5 < (byte)(cVar21 - 0x3aU));
                }
                *in = pcVar16;
                std::
                vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                ::reserve(local_150,uVar26);
                if ((int)uVar26 != 0) {
                  iVar12 = 0;
                  bVar10 = false;
                  local_38 = uVar26;
LAB_00403910:
                  local_164 = iVar12;
                  GetNextLine(this);
                  pcVar16 = this->buffer;
                  iVar12 = strncmp("SURF",pcVar16,4);
                  if (iVar12 == 0) {
                    bVar27 = pcVar16[4];
                    if ((0x20 < (ulong)bVar27) ||
                       ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) == 0)) goto LAB_00403938;
                    pcVar29 = pcVar16 + 5;
                    if (bVar27 == 0) {
                      pcVar29 = pcVar16 + 4;
                    }
                  }
                  else {
LAB_00403938:
                    if (!bVar10) {
                      pLVar18 = DefaultLogger::get();
                      Logger::warn(pLVar18,"AC3D: SURF token was expected");
                      pLVar18 = DefaultLogger::get();
                      Logger::debug(pLVar18,"Continuing with Quick3D Workaround enabled");
                    }
                    bVar10 = true;
                    pcVar29 = *in + -1;
                  }
                  *in = pcVar29;
                  for (; (*pcVar29 == ' ' || (*pcVar29 == '\t')); pcVar29 = pcVar29 + 1) {
                  }
                  *in = pcVar29;
                  local_128 = (pointer)0x0;
                  aStack_120._M_allocated_capacity = 0;
                  local_138 = (undefined1  [4])0x0;
                  fStack_134 = 0.0;
                  fStack_130 = 0.0;
                  uStack_12c = 0;
                  std::
                  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                  ::emplace_back<Assimp::AC3DImporter::Surface>(local_150,(Surface *)local_138);
                  pvVar8 = (void *)CONCAT44(uStack_12c,fStack_130);
                  if (pvVar8 != (void *)0x0) {
                    operator_delete(pvVar8,aStack_120._M_allocated_capacity - (long)pvVar8);
                  }
                  pSVar5 = pOVar4[-1].surfaces.
                           super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pcVar16 = *in;
                  cVar21 = *pcVar16;
                  if (cVar21 == '0') {
                    cVar21 = pcVar16[1];
                    if (cVar21 == 'x') {
                      pcVar16 = pcVar16 + 2;
                      uVar23 = 0;
                      do {
                        cVar21 = *pcVar16;
                        if ((byte)(cVar21 - 0x30U) < 10) {
                          uVar23 = uVar23 << 4 | (uint)(byte)(cVar21 - 0x30U);
                        }
                        else {
                          bVar27 = cVar21 + 0xbf;
                          if ((5 < bVar27) && (bVar27 = cVar21 + 0x9f, 5 < bVar27))
                          goto LAB_00403a9c;
                          uVar23 = uVar23 * 0x10 + (uint)bVar27 + 10;
                        }
                        pcVar16 = pcVar16 + 1;
                      } while( true );
                    }
                    if (0xf7 < (byte)(cVar21 - 0x38U)) {
                      pcVar16 = pcVar16 + 2;
                      uVar23 = 0;
                      do {
                        uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 8;
                        cVar21 = *pcVar16;
                        pcVar16 = pcVar16 + 1;
                      } while (0xf7 < (byte)(cVar21 - 0x38U));
                      goto LAB_00403a9c;
                    }
                  }
                  else if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                    uVar23 = 0;
                    do {
                      pcVar16 = pcVar16 + 1;
                      uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                      cVar21 = *pcVar16;
                    } while (0xf5 < (byte)(cVar21 - 0x3aU));
                    goto LAB_00403a9c;
                  }
                  uVar23 = 0;
LAB_00403a9c:
                  pSVar5[-1].flags = uVar23;
                  bVar11 = GetNextLine(this);
                  if (!bVar11) {
LAB_004040ae:
                    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                    _local_138 = &local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_138,"AC3D: Unexpected EOF: surface is incomplete","")
                    ;
                    std::runtime_error::runtime_error(prVar20,(string *)local_138);
                    *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_148 = (vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                               *)&pSVar5[-1].entries;
                  do {
                    pcVar16 = *in;
                    iVar12 = strncmp("mat",pcVar16,3);
                    if (iVar12 == 0) {
                      bVar27 = pcVar16[3];
                      if ((0x20 < (ulong)bVar27) ||
                         ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) == 0)) goto LAB_00403ad7;
                      pcVar29 = pcVar16 + 4;
                      if (bVar27 == 0) {
                        pcVar29 = pcVar16 + 3;
                      }
                      *in = pcVar29;
                      pcVar16 = pcVar29;
                      while( true ) {
                        pcVar16 = pcVar16 + 1;
                        if ((*pcVar29 != ' ') && (*pcVar29 != '\t')) break;
                        pcVar29 = pcVar29 + 1;
                      }
                      *in = pcVar29;
                      cVar21 = *pcVar29;
                      uVar23 = 0;
                      if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                        uVar23 = 0;
                        do {
                          uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                          cVar21 = *pcVar16;
                          pcVar16 = pcVar16 + 1;
                        } while (0xf5 < (byte)(cVar21 - 0x3aU));
                      }
                      pSVar5[-1].mat = uVar23;
                    }
                    else {
LAB_00403ad7:
                      pcVar16 = *in;
                      iVar12 = strncmp("refs",pcVar16,4);
                      lVar25 = -1;
                      if (iVar12 != 0) goto LAB_00403dc0;
                      bVar27 = pcVar16[4];
                      if ((0x20 < (ulong)bVar27) ||
                         ((0x100003601U >> ((ulong)bVar27 & 0x3f) & 1) == 0)) goto LAB_00403dc0;
                      pcVar29 = pcVar16 + 5;
                      if (bVar27 == 0) {
                        pcVar29 = pcVar16 + 4;
                      }
                      *in = pcVar29;
                      if ((bVar10) &&
                         (pSVar5[-1].entries.
                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          pSVar5[-1].entries.
                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00403db9;
                      pcVar16 = *in;
                      pcVar29 = pcVar16;
                      while( true ) {
                        pcVar29 = pcVar29 + 1;
                        if ((*pcVar16 != ' ') && (*pcVar16 != '\t')) break;
                        pcVar16 = pcVar16 + 1;
                      }
                      *in = pcVar16;
                      cVar21 = *pcVar16;
                      uVar23 = 0;
                      if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                        uVar23 = 0;
                        do {
                          uVar23 = (uint)(byte)(cVar21 - 0x30) + uVar23 * 10;
                          cVar21 = *pcVar29;
                          pcVar29 = pcVar29 + 1;
                        } while (0xf5 < (byte)(cVar21 - 0x3aU));
                      }
                      std::
                      vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                      ::reserve((vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                 *)local_148,(ulong)uVar23);
                      pOVar4[-1].numRefs = pOVar4[-1].numRefs + uVar23;
                      if (uVar23 != 0) {
                        uVar30 = 0;
                        do {
                          bVar11 = GetNextLine(this);
                          if (!bVar11) {
                            pLVar18 = DefaultLogger::get();
                            Logger::error(pLVar18,
                                          "AC3D: Unexpected EOF: surface references are incomplete")
                            ;
                            break;
                          }
                          local_138 = (undefined1  [4])0x0;
                          fStack_134 = 0.0;
                          fStack_130 = 0.0;
                          __position_00._M_current =
                               pSVar5[-1].entries.
                               super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position_00._M_current ==
                              pSVar5[-1].entries.
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::
                            vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                            ::_M_realloc_insert<std::pair<unsigned_int,aiVector2t<float>>>
                                      (local_148,__position_00,
                                       (pair<unsigned_int,_aiVector2t<float>_> *)local_138);
                          }
                          else {
                            ((__position_00._M_current)->second).y = 0.0;
                            (__position_00._M_current)->first = 0;
                            ((__position_00._M_current)->second).x = 0.0;
                            pppVar1 = &pSVar5[-1].entries.
                                       super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *pppVar1 = *pppVar1 + 1;
                          }
                          ppVar6 = pSVar5[-1].entries.
                                   super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          pcVar16 = *in;
                          cVar21 = *pcVar16;
                          uVar24 = 0;
                          if (0xf5 < (byte)(cVar21 - 0x3aU)) {
                            uVar24 = 0;
                            do {
                              uVar24 = (uint)(byte)(cVar21 - 0x30) + uVar24 * 10;
                              cVar21 = pcVar16[1];
                              pcVar16 = pcVar16 + 1;
                            } while (0xf5 < (byte)(cVar21 - 0x3aU));
                          }
                          *in = pcVar16;
                          ppVar6[-1].first = uVar24;
                          for (pbVar19 = (byte *)*in; (*pbVar19 == 0x20 || (*pbVar19 == 9));
                              pbVar19 = pbVar19 + 1) {
                          }
                          *in = (char *)pbVar19;
                          while( true ) {
                            bVar27 = *pbVar19;
                            uVar26 = (ulong)bVar27;
                            if ((bVar27 != 0x20) && (bVar27 != 9)) break;
                            pbVar19 = pbVar19 + 1;
                          }
                          *in = (char *)pbVar19;
                          if ((*pbVar19 < 0xe) &&
                             (uVar26 = 0x3401, (0x3401U >> (*pbVar19 & 0x1f) & 1) != 0)) {
                            pLVar18 = DefaultLogger::get();
                            Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                          }
                          else {
                            lVar25 = 0;
                            do {
                              for (pAVar28 = (Assimp *)*in;
                                  (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9));
                                  pAVar28 = pAVar28 + 1) {
                              }
                              *in = (char *)pAVar28;
                              if (((byte)*pAVar28 < 0xe) &&
                                 (uVar26 = 0x3401, (0x3401U >> ((byte)*pAVar28 & 0x1f) & 1) != 0)) {
                                pLVar18 = DefaultLogger::get();
                                Logger::error(pLVar18,"AC3D: Unexpected EOF/EOL");
                              }
                              else {
                                pcVar16 = fast_atoreal_move<float>
                                                    (pAVar28,(char *)((long)ppVar6 + lVar25 * 4 + -8
                                                                     ),(float *)0x1,SUB81(uVar26,0))
                                ;
                                *in = pcVar16;
                              }
                              bVar11 = lVar25 == 0;
                              lVar25 = lVar25 + 1;
                            } while (bVar11);
                          }
                          uVar30 = uVar30 + 1;
                          this = local_140;
                        } while (uVar30 != uVar23);
                      }
                    }
                    bVar11 = GetNextLine(this);
                    if (!bVar11) goto LAB_004040ae;
                  } while( true );
                }
              }
            }
          }
LAB_00403715:
          bVar10 = GetNextLine(this);
        } while (bVar10);
      }
      pLVar18 = DefaultLogger::get();
      Logger::error(pLVar18,"AC3D: Unexpected EOF: \'kids\' line was expected");
    }
  }
  return;
LAB_00403db9:
  lVar25 = -6;
LAB_00403dc0:
  *in = *in + lVar25;
  iVar12 = local_164 + 1;
  if (iVar12 == (int)local_38) goto LAB_00403715;
  goto LAB_00403910;
}

Assistant:

void AC3DImporter::LoadObjectSection(std::vector<Object>& objects)
{
    if (!TokenMatch(buffer,"OBJECT",6))
        return;

    SkipSpaces(&buffer);

    ++mNumMeshes;

    objects.push_back(Object());
    Object& obj = objects.back();

    aiLight* light = NULL;
    if (!ASSIMP_strincmp(buffer,"light",5))
    {
        // This is a light source. Add it to the list
        mLights->push_back(light = new aiLight());

        // Return a point light with no attenuation
        light->mType = aiLightSource_POINT;
        light->mColorDiffuse = light->mColorSpecular = aiColor3D(1.f,1.f,1.f);
        light->mAttenuationConstant = 1.f;

        // Generate a default name for both the light source and the node
        // FIXME - what's the right way to print a size_t? Is 'zu' universally available? stick with the safe version.
        light->mName.length = ::ai_snprintf(light->mName.data, MAXLEN, "ACLight_%i",static_cast<unsigned int>(mLights->size())-1);
        obj.name = std::string( light->mName.data );

        ASSIMP_LOG_DEBUG("AC3D: Light source encountered");
        obj.type = Object::Light;
    }
    else if (!ASSIMP_strincmp(buffer,"group",5))
    {
        obj.type = Object::Group;
    }
    else if (!ASSIMP_strincmp(buffer,"world",5))
    {
        obj.type = Object::World;
    }
    else obj.type = Object::Poly;
    while (GetNextLine())
    {
        if (TokenMatch(buffer,"kids",4))
        {
            SkipSpaces(&buffer);
            unsigned int num = strtoul10(buffer,&buffer);
            GetNextLine();
            if (num)
            {
                // load the children of this object recursively
                obj.children.reserve(num);
                for (unsigned int i = 0; i < num; ++i)
                    LoadObjectSection(obj.children);
            }
            return;
        }
        else if (TokenMatch(buffer,"name",4))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.name);

            // If this is a light source, we'll also need to store
            // the name of the node in it.
            if (light)
            {
                light->mName.Set(obj.name);
            }
        }
        else if (TokenMatch(buffer,"texture",7))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.texture);
        }
        else if (TokenMatch(buffer,"texrep",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texRepeat);
            if (!obj.texRepeat.x || !obj.texRepeat.y)
                obj.texRepeat = aiVector2D (1.f,1.f);
        }
        else if (TokenMatch(buffer,"texoff",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texOffset);
        }
        else if (TokenMatch(buffer,"rot",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,9,&obj.rotation);
        }
        else if (TokenMatch(buffer,"loc",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&obj.translation);
        }
        else if (TokenMatch(buffer,"subdiv",6))
        {
            SkipSpaces(&buffer);
            obj.subDiv = strtoul10(buffer,&buffer);
        }
        else if (TokenMatch(buffer,"crease",6))
        {
            SkipSpaces(&buffer);
            obj.crease = fast_atof(buffer);
        }
        else if (TokenMatch(buffer,"numvert",7))
        {
            SkipSpaces(&buffer);

            unsigned int t = strtoul10(buffer,&buffer);
            if (t >= AI_MAX_ALLOC(aiVector3D)) {
                throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
            }
            obj.vertices.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                if (!GetNextLine())
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: not all vertices have been parsed yet");
                    break;
                }
                else if (!IsNumeric(*buffer))
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected token: not all vertices have been parsed yet");
                    --buffer; // make sure the line is processed a second time
                    break;
                }
                obj.vertices.push_back(aiVector3D());
                aiVector3D& v = obj.vertices.back();
                AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&v.x);
            }
        }
        else if (TokenMatch(buffer,"numsurf",7))
        {
            SkipSpaces(&buffer);

            bool Q3DWorkAround = false;

            const unsigned int t = strtoul10(buffer,&buffer);
            obj.surfaces.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                GetNextLine();
                if (!TokenMatch(buffer,"SURF",4))
                {
                    // FIX: this can occur for some files - Quick 3D for
                    // example writes no surf chunks
                    if (!Q3DWorkAround)
                    {
                        ASSIMP_LOG_WARN("AC3D: SURF token was expected");
                        ASSIMP_LOG_DEBUG("Continuing with Quick3D Workaround enabled");
                    }
                    --buffer; // make sure the line is processed a second time
                    // break; --- see fix notes above

                    Q3DWorkAround = true;
                }
                SkipSpaces(&buffer);
                obj.surfaces.push_back(Surface());
                Surface& surf = obj.surfaces.back();
                surf.flags = strtoul_cppstyle(buffer);

                while (1)
                {
                    if(!GetNextLine())
                    {
                        throw DeadlyImportError("AC3D: Unexpected EOF: surface is incomplete");
                    }
                    if (TokenMatch(buffer,"mat",3))
                    {
                        SkipSpaces(&buffer);
                        surf.mat = strtoul10(buffer);
                    }
                    else if (TokenMatch(buffer,"refs",4))
                    {
                        // --- see fix notes above
                        if (Q3DWorkAround)
                        {
                            if (!surf.entries.empty())
                            {
                                buffer -= 6;
                                break;
                            }
                        }

                        SkipSpaces(&buffer);
                        const unsigned int m = strtoul10(buffer);
                        surf.entries.reserve(m);

                        obj.numRefs += m;

                        for (unsigned int k = 0; k < m; ++k)
                        {
                            if(!GetNextLine())
                            {
                                ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: surface references are incomplete");
                                break;
                            }
                            surf.entries.push_back(Surface::SurfaceEntry());
                            Surface::SurfaceEntry& entry = surf.entries.back();

                            entry.first = strtoul10(buffer,&buffer);
                            SkipSpaces(&buffer);
                            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&entry.second);
                        }
                    }
                    else
                    {

                        --buffer; // make sure the line is processed a second time
                        break;
                    }
                }
            }
        }
    }
    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: \'kids\' line was expected");
}